

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FreeTypeInitializationTest.cpp
# Opt level: O3

EStatusCode
ShowFaceProperties(FreeTypeWrapper *inFreeType,string *inFontFilePath,
                  string *inSecondaryFontFilePath)

{
  _Alloc_hider _Var1;
  FT_UShort FVar2;
  FT_Error FVar3;
  BoolAndFTShort BVar4;
  BoolAndFTShort BVar5;
  EFontStretch EVar6;
  FT_UInt glyph_index;
  FT_Face inFace;
  FT_Face pFVar7;
  char *pcVar8;
  size_t sVar9;
  ostream *poVar10;
  long lVar11;
  EStatusCode EVar12;
  ostream *poVar13;
  char *pcVar14;
  bool bVar15;
  double dVar16;
  FT_Bool isCID;
  FT_Int supplement;
  FT_ULong length;
  char *ordering;
  FreeTypeFaceWrapper face;
  FT_Bool local_10d;
  int local_10c;
  string local_108;
  char *local_e0;
  FreeTypeFaceWrapper local_d8;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Start Font\n",0xb);
  if (inSecondaryFontFilePath->_M_string_length == 0) {
    inFace = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,0);
  }
  else {
    inFace = FreeTypeWrapper::NewFace(inFreeType,inFontFilePath,inSecondaryFontFilePath,0);
  }
  if (inFace == (FT_Face)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Failed to load font from ",0x19);
    pcVar8 = (inFontFilePath->_M_dataplus)._M_p;
    if (pcVar8 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar9 = strlen(pcVar8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    EVar12 = eFailure;
    goto LAB_00138300;
  }
  local_108._M_string_length = 0;
  local_108.field_2._M_local_buf[0] = '\0';
  local_108._M_dataplus._M_p = (pointer)&local_108.field_2;
  FreeTypeFaceWrapper::FreeTypeFaceWrapper(&local_d8,inFace,&local_108,0,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_108._M_dataplus._M_p != &local_108.field_2) {
    operator_delete(local_108._M_dataplus._M_p,
                    CONCAT71(local_108.field_2._M_allocated_capacity._1_7_,
                             local_108.field_2._M_local_buf[0]) + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Font Family = ",0xe);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  if (pFVar7->family_name == (FT_String *)0x0) {
    pcVar8 = "somefont";
LAB_001379a8:
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
    pcVar8 = pFVar7->family_name;
    if (pcVar8 != (FT_String *)0x0) goto LAB_001379a8;
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Font Style = ",0xd);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  if (pFVar7->style_name == (FT_String *)0x0) {
    pcVar8 = "somestyle";
LAB_00137a3a:
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
    pcVar8 = pFVar7->style_name;
    if (pcVar8 != (FT_String *)0x0) goto LAB_00137a3a;
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Font Format = ",0xe);
  pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
  pcVar8 = FT_Get_X11_Font_Format(pFVar7);
  if (pcVar8 == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
  }
  else {
    sVar9 = strlen(pcVar8);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,sVar9);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Font CID Keyed (does not includes sfnts) = ",0x2b);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  bVar15 = ((uint)pFVar7->face_flags >> 0xc & 1) != 0;
  pcVar14 = "yes";
  pcVar8 = "yes";
  if (!bVar15) {
    pcVar8 = "no";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,(ulong)bVar15 + 2)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Font SFNT modeled = ",0x14);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  bVar15 = (pFVar7->face_flags & 8) == 0;
  pcVar8 = "yes";
  if (bVar15) {
    pcVar8 = "no";
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,(ulong)bVar15 ^ 3)
  ;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  if ((pFVar7->face_flags & 8) != 0) {
    local_108._M_dataplus._M_p = (pointer)0x0;
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
    FVar3 = FT_Load_Sfnt_Table(pFVar7,0x43464620,0,(FT_Byte *)0x0,(FT_ULong *)&local_108);
    if (FVar3 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"CCF table found, length is ",0x1b);
      poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
      std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
    }
  }
  pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
  FVar3 = FT_Get_CID_Is_Internally_CID_Keyed(pFVar7,&local_10d);
  if (FVar3 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Font Internally CID (checks also sfnts) = ",0x2a);
    if (local_10d == '\0') {
      pcVar14 = "no";
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,pcVar14,(ulong)(local_10d == '\0') ^ 3);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if (local_10d == '\0') goto LAB_00137c5f;
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
    FVar3 = FT_Get_CID_Registry_Ordering_Supplement(pFVar7,(char **)&local_108,&local_e0,&local_10c)
    ;
    if (FVar3 == 0) {
      EVar12 = eSuccess;
    }
    else {
      EVar12 = eFailure;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,
                 "Failed to read registry, ordering and supplement informaiton\n",0x3d);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CID Registry = ",0xf);
    _Var1._M_p = local_108._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_108._M_dataplus._M_p ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar9 = strlen(local_108._M_dataplus._M_p);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,_Var1._M_p,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"CID Ordering = ",0xf);
    if (local_e0 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cout + -0x18) + 0x3c43c8);
    }
    else {
      sVar9 = strlen(local_e0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,local_e0,sVar9);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"CID Supplement = ",0x11);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_10c);
    std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"No CID information to read\n",0x1b);
    local_10d = '\0';
LAB_00137c5f:
    EVar12 = eSuccess;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Font BBox = [",0xd);
  FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10," ",1);
  FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"]\n",2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Ascent ",7);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pFVar7->ascender);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Descent ",8);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,pFVar7->descender);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Italic Angle = ",0xf);
  dVar16 = FreeTypeFaceWrapper::GetItalicAngle(&local_d8);
  poVar13 = (ostream *)&std::cout;
  poVar10 = std::ostream::_M_insert<double>(dVar16);
  pcVar8 = "\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  BVar4 = FreeTypeFaceWrapper::GetCapHeight(&local_d8);
  if (((uint)BVar4 & 1) == 0) {
    lVar11 = 0x14;
    pcVar14 = "No Cap Height value\n";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Cap Height = ",0xd);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,BVar4.second);
    lVar11 = 1;
    pcVar14 = "\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar14,lVar11);
  BVar5 = FreeTypeFaceWrapper::GetxHeight(&local_d8);
  if (((uint)BVar4 & 1) == 0) {
    lVar11 = 0x12;
    pcVar8 = "No x Height value\n";
    poVar10 = (ostream *)&std::cout;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"x Height = ",0xb);
    poVar10 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,BVar5.second);
    lVar11 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"StemV = ",8);
  FreeTypeFaceWrapper::GetStemV(&local_d8);
  poVar13 = (ostream *)&std::cout;
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  pcVar8 = "\n";
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  EVar6 = FreeTypeFaceWrapper::GetFontStretch(&local_d8);
  if (EVar6 == eFontStretchUknown) {
    lVar11 = 0xe;
    pcVar8 = "Unkown Stretch";
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Stretch = ",10);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,EVar6);
    lVar11 = 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar13,pcVar8,lVar11);
  FVar2 = FreeTypeFaceWrapper::GetFontWeight(&local_d8);
  if (FVar2 == 1000) {
    lVar11 = 0xe;
    pcVar8 = "Unknown Weight";
    poVar10 = (ostream *)&std::cout;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Weight = ",9);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    lVar11 = 1;
    pcVar8 = "\n";
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,pcVar8,lVar11);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"FontFlags = ",0xc);
  FreeTypeFaceWrapper::GetFontFlags(&local_d8);
  poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  pFVar7 = FreeTypeFaceWrapper::operator->(&local_d8);
  if ((pFVar7->face_flags & 0x200) == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Font does not have glyph names\n",0x1f);
  }
  else {
    pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
    glyph_index = FT_Get_Char_Index(pFVar7,0x31);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Font has glyph names\n",0x15);
    if (glyph_index != 0) {
      pFVar7 = FreeTypeFaceWrapper::operator_cast_to_FT_FaceRec__(&local_d8);
      FVar3 = FT_Get_Glyph_Name(pFVar7,glyph_index,&local_108,0x1f);
      if (FVar3 == 0) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,"Glyph name for the 1 = ",0x17);
        sVar9 = strlen((char *)&local_108);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,(char *)&local_108,sVar9);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      }
    }
  }
  FreeTypeFaceWrapper::~FreeTypeFaceWrapper(&local_d8);
LAB_00138300:
  FreeTypeWrapper::DoneFace(inFreeType,inFace);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"End Font\n\n",10);
  return EVar12;
}

Assistant:

static EStatusCode ShowFaceProperties(FreeTypeWrapper& inFreeType,const string& inFontFilePath,const string& inSecondaryFontFilePath = "")
{
	FT_Face face;
	EStatusCode status = PDFHummus::eSuccess;

	do
	{
		cout<<"Start Font\n";
		if(inSecondaryFontFilePath.length() > 0)
			face = inFreeType.NewFace(inFontFilePath,inSecondaryFontFilePath,0);
		else
			face = inFreeType.NewFace(inFontFilePath,0);
		if(!face)
		{
			status = PDFHummus::eFailure;
			cout<<"Failed to load font from "<<inFontFilePath.c_str()<<"\n";
			break;
		}
		status = ShowGlobalFontProperties(inFreeType,face);
	}
	while(false);

	inFreeType.DoneFace(face);
	cout<<"End Font\n\n";
	return status;
}